

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

Input * __thiscall
helics::ValueFederateManager::getInput(ValueFederateManager *this,string_view key)

{
  int iVar1;
  Input **ppIVar2;
  Input *pIVar3;
  BlockIterator<helics::Input,_32,_helics::Input_**> inpF;
  handle inpHandle;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_48;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_30,&this->inputs);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_48,local_30.data,key);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppIVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppIVar2 == (Input **)0x0) {
      ppIVar2 = (Input **)
                &gmlc::containers::StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>
                 ::end()::emptyValue;
    }
    else {
      ppIVar2 = ppIVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppIVar2 = ppIVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  pIVar3 = local_48.ptr;
  if (((ppIVar2 == local_48.vec) ||
      (((local_48.vec != (Input **)0x0 && (*local_48.vec == (Input *)0x0)) &&
       (*ppIVar2 == (Input *)0x0)))) && (iVar1 == local_48.offset)) {
    pIVar3 = (Input *)invalidIptNC;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  return pIVar3;
}

Assistant:

Input& ValueFederateManager::getInput(std::string_view key)
{
    auto inpHandle = inputs.lock();
    auto inpF = inpHandle->find(key);
    if (inpF != inpHandle->end()) {
        return *inpF;
    }
    return invalidIptNC;
}